

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::PerspectiveCameraNode> *camera,ssize_t id)

{
  ostream *poVar1;
  ulong uVar2;
  undefined1 *puVar3;
  
  if (this->ident != 0) {
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->ident);
  }
  puVar3 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"<PerspectiveCamera ",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"id=\"",4);
  poVar1 = std::ostream::_M_insert<long>((long)puVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"name=\"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(camera->ptr->super_Node).name._M_dataplus._M_p,
                      (camera->ptr->super_Node).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"from=\"",6);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).from.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).from.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).from.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"to=\"",4);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).to.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).to.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).to.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"up=\"",4);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).up.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).up.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).up.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"fov=\"",5);
  poVar1 = std::ostream::_M_insert<double>((double)(camera->ptr->data).fov);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/>",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::PerspectiveCameraNode> camera, ssize_t id)
  {
    tab(); 
    xml << "<PerspectiveCamera " <<
      "id=\"" << id << "\" " << 
      "name=\"" << camera->name << "\" " <<
      "from=\"" << camera->data.from.x << " " << camera->data.from.y << " " << camera->data.from.z << "\" " <<
      "to=\""   << camera->data.to.x   << " " << camera->data.to.y   << " " << camera->data.to.z << "\" " <<
      "up=\""   << camera->data.up.x   << " " << camera->data.up.y   << " " << camera->data.up.z << "\" " <<
      "fov=\""  << camera->data.fov << "\" " << "/>" << std::endl;
  }